

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O1

void makePreviewImage(Array2D<Imf_3_4::Rgba> *pixels,int width,int height,
                     Array2D<Imf_3_4::PreviewRgba> *previewPixels,int *previewWidth,
                     int *previewHeight)

{
  int iVar1;
  Rgba *pRVar2;
  int iVar3;
  PreviewRgba *pPVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  iVar3 = width + 7;
  if (-1 < width) {
    iVar3 = width;
  }
  *previewWidth = iVar3 >> 3;
  iVar3 = height + 7;
  if (-1 < height) {
    iVar3 = height;
  }
  iVar3 = iVar3 >> 3;
  *previewHeight = iVar3;
  iVar1 = *previewWidth;
  uVar7 = (long)iVar1 * (long)iVar3;
  pPVar4 = (PreviewRgba *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
  if (uVar7 != 0) {
    lVar5 = 0;
    do {
      *(undefined4 *)(&pPVar4->r + lVar5) = 0xff000000;
      lVar5 = lVar5 + 4;
    } while (uVar7 * 4 - lVar5 != 0);
  }
  if (previewPixels->_data != (PreviewRgba *)0x0) {
    operator_delete__(previewPixels->_data);
  }
  previewPixels->_sizeX = (long)iVar3;
  previewPixels->_sizeY = (long)iVar1;
  previewPixels->_data = pPVar4;
  if (0 < *previewHeight) {
    lVar5 = 0;
    lVar9 = 0;
    lVar8 = 0;
    do {
      if (0 < *previewWidth) {
        lVar11 = 4;
        lVar10 = 0;
        do {
          lVar12 = pixels->_sizeY * lVar5;
          pRVar2 = pixels->_data;
          lVar6 = previewPixels->_sizeY * lVar9;
          pPVar4 = previewPixels->_data;
          fVar14 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)pRVar2 + lVar11 + -4 + lVar12) * 4);
          if (fVar14 <= 0.0) {
            fVar14 = 0.0;
          }
          fVar13 = powf(fVar14 * 5.5555,0.4545);
          fVar13 = fVar13 * 84.66;
          fVar14 = 255.0;
          if (fVar13 <= 255.0) {
            fVar14 = fVar13;
          }
          (&pPVar4[lVar10].r)[lVar6] = (uchar)(int)(float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14);
          fVar14 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)pRVar2 + lVar11 + -2 + lVar12) * 4);
          if (fVar14 <= 0.0) {
            fVar14 = 0.0;
          }
          fVar13 = powf(fVar14 * 5.5555,0.4545);
          fVar13 = fVar13 * 84.66;
          fVar14 = 255.0;
          if (fVar13 <= 255.0) {
            fVar14 = fVar13;
          }
          (&pPVar4[lVar10].g)[lVar6] = (uchar)(int)(float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14);
          fVar14 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)&(pRVar2->r)._h + lVar11 + lVar12) * 4);
          if (fVar14 <= 0.0) {
            fVar14 = 0.0;
          }
          fVar13 = powf(fVar14 * 5.5555,0.4545);
          fVar13 = fVar13 * 84.66;
          fVar14 = 255.0;
          if (fVar13 <= 255.0) {
            fVar14 = fVar13;
          }
          (&pPVar4[lVar10].b)[lVar6] = (uchar)(int)(float)(~-(uint)(fVar13 < 0.0) & (uint)fVar14);
          fVar13 = *(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)((long)&(pRVar2->g)._h + lVar11 + lVar12) * 4) *
                   255.0;
          fVar14 = 255.0;
          if (fVar13 <= 255.0) {
            fVar14 = fVar13;
          }
          (&pPVar4[lVar10].a)[lVar6] =
               (uchar)(int)(float)(-(uint)(fVar13 < 0.0) & 0x3f000000 |
                                  ~-(uint)(fVar13 < 0.0) & (uint)(fVar14 + 0.5));
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x40;
        } while (lVar10 < *previewWidth);
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 4;
      lVar5 = lVar5 + 0x40;
    } while (lVar8 < *previewHeight);
  }
  return;
}

Assistant:

void
makePreviewImage (
    const Array2D<Rgba>&  pixels,
    int                   width,
    int                   height,
    Array2D<PreviewRgba>& previewPixels,
    int&                  previewWidth,
    int&                  previewHeight)
{
    const int N = 8;

    previewWidth  = width / N;
    previewHeight = height / N;
    previewPixels.resizeErase (previewHeight, previewWidth);

    for (int y = 0; y < previewHeight; ++y)
    {
        for (int x = 0; x < previewWidth; ++x)
        {
            const Rgba&  inPixel  = pixels[y * N][x * N];
            PreviewRgba& outPixel = previewPixels[y][x];

            outPixel.r = gamma (inPixel.r);
            outPixel.g = gamma (inPixel.g);
            outPixel.b = gamma (inPixel.b);
            outPixel.a = int (
                IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) + 0.5f);
        }
    }
}